

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProperty.cc
# Opt level: O0

void __thiscall OpenMesh::BaseProperty::stats(BaseProperty *this,ostream *_ostr)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  ostream *_ostr_local;
  BaseProperty *this_local;
  
  poVar2 = std::operator<<(_ostr,"  ");
  psVar3 = name_abi_cxx11_(this);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  bVar1 = persistent(this);
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = ", persistent ";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void BaseProperty::stats(std::ostream& _ostr) const
{
  _ostr << "  " << name() << (persistent() ? ", persistent " : "") << "\n";
}